

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

int Abc_TtWriteHexRev(char *pStr,word *pTruth,int nVars)

{
  char cVar1;
  int iVar2;
  int local_3c;
  int local_34;
  int StartK;
  int k;
  char *pStrInit;
  word *pThis;
  int nVars_local;
  word *pTruth_local;
  char *pStr_local;
  
  if (nVars < 6) {
    local_3c = 1 << ((char)nVars - 2U & 0x1f);
  }
  else {
    local_3c = 0x10;
  }
  if (nVars < 2) {
    __assert_fail("nVars >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                  ,0x4f1,"int Abc_TtWriteHexRev(char *, word *, int)");
  }
  iVar2 = Abc_TtWordNum(nVars);
  pStrInit = (char *)(pTruth + iVar2);
  pTruth_local = (word *)pStr;
  while (pStrInit = (char *)((long)pStrInit + -8), local_34 = local_3c, pTruth <= pStrInit) {
    while (local_34 = local_34 + -1, -1 < local_34) {
      cVar1 = Abc_TtPrintDigit((uint)(*(ulong *)pStrInit >> ((char)local_34 * '\x04' & 0x3fU)) & 0xf
                              );
      *(char *)pTruth_local = cVar1;
      pTruth_local = (word *)((long)pTruth_local + 1);
    }
  }
  return (int)pTruth_local - (int)pStr;
}

Assistant:

static inline int Abc_TtWriteHexRev( char * pStr, word * pTruth, int nVars )
{
    word * pThis;
    char * pStrInit = pStr;
    int k, StartK = nVars >= 6 ? 16 : (1 << (nVars - 2));
    assert( nVars >= 2 );
    for ( pThis = pTruth + Abc_TtWordNum(nVars) - 1; pThis >= pTruth; pThis-- )
        for ( k = StartK - 1; k >= 0; k-- )
            *pStr++ = Abc_TtPrintDigit( (int)(pThis[0] >> (k << 2)) & 15 );
    return pStr - pStrInit;
}